

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leave.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::computePrimalray4Row(SPxSolverBase<double> *this,double direction)

{
  double dVar1;
  int i_00;
  UpdateVector<double> *pUVar2;
  int i;
  long lVar3;
  double local_28;
  
  (this->primalRay).super_SVectorBase<double>.memused = 0;
  DSVectorBase<double>::setMax(&this->primalRay,(this->theCoPvec->thedelta).super_IdxSet.num);
  for (lVar3 = 0; pUVar2 = this->theCoPvec, lVar3 < (pUVar2->thedelta).super_IdxSet.num;
      lVar3 = lVar3 + 1) {
    i_00 = (pUVar2->thedelta).super_IdxSet.idx[lVar3];
    dVar1 = (pUVar2->thedelta).super_VectorBase<double>.val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[i_00];
    local_28 = (double)(~-(ulong)(0.0 < direction) & (ulong)-dVar1 |
                       -(ulong)(0.0 < direction) & (ulong)dVar1);
    DSVectorBase<double>::add(&this->primalRay,i_00,&local_28);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computePrimalray4Row(R direction)
{
   R sign = (direction > 0 ? 1.0 : -1.0);

   primalRay.clear();
   primalRay.setMax(coPvec().delta().size());

   for(int i = 0; i < coPvec().delta().size(); ++i)
      primalRay.add(coPvec().delta().index(i), sign * coPvec().delta().value(i));
}